

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O0

void __thiscall QIconLoader::invalidateKey(QIconLoader *this)

{
  int *in_RDI;
  
  *in_RDI = *in_RDI + 1;
  std::optional<QIconEnginePlugin_*>::operator=((optional<QIconEnginePlugin_*> *)(in_RDI + 2));
  return;
}

Assistant:

void QIconLoader::invalidateKey()
{
    // Invalidating the key here will result in QThemeIconEngine
    // recreating the actual engine the next time the icon is used.
    // We don't need to clear the QIcon cache itself.
    m_themeKey++;

    // invalidating the factory results in us looking once for
    // a plugin that provides icon for the new themeName()
    m_factory = std::nullopt;
}